

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ms_gauden.c
# Opt level: O3

gauden_t * gauden_init(char *meanfile,char *varfile,float32 varfloor,logmath_t *lmath)

{
  gauden_t *g;
  logmath_t *plVar1;
  float ****ppppfVar2;
  ulong uVar3;
  int32 d;
  int32 f;
  int32 m;
  int32 *flen;
  int local_4c;
  uint local_48;
  int local_44;
  int32 *local_40;
  logmath_t *local_38;
  
  if (meanfile == (char *)0x0) {
    __assert_fail("meanfile != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
                  ,0x13d,"gauden_t *gauden_init(const char *, const char *, float32, logmath_t *)");
  }
  if (varfile == (char *)0x0) {
    __assert_fail("varfile != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
                  ,0x13e,"gauden_t *gauden_init(const char *, const char *, float32, logmath_t *)");
  }
  if ((float)varfloor <= 0.0) {
    __assert_fail("varfloor > 0.0",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
                  ,0x13f,"gauden_t *gauden_init(const char *, const char *, float32, logmath_t *)");
  }
  g = (gauden_t *)
      __ckd_calloc__(1,0x38,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
                     ,0x141);
  local_38 = lmath;
  plVar1 = logmath_retain(lmath);
  g->lmath = plVar1;
  ppppfVar2 = gauden_param_read(meanfile,&g->n_mgau,&g->n_feat,&g->n_density,&g->featlen);
  g->mean = (mfcc_t ****)ppppfVar2;
  if (ppppfVar2 != (float ****)0x0) {
    ppppfVar2 = gauden_param_read(varfile,&local_44,(int32 *)&local_48,&local_4c,&local_40);
    plVar1 = local_38;
    g->var = (mfcc_t ****)ppppfVar2;
    if (ppppfVar2 != (float ****)0x0) {
      if (((local_44 == g->n_mgau) && (local_48 == g->n_feat)) && (local_4c == g->n_density)) {
        if (0 < (int)local_48) {
          uVar3 = 0;
          do {
            if (g->featlen[uVar3] != local_40[uVar3]) {
              err_msg(ERR_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
                      ,0x158,"Feature lengths for means and variances differ\n");
              goto LAB_0014bc67;
            }
            uVar3 = uVar3 + 1;
          } while (local_48 != uVar3);
        }
        ckd_free(local_40);
        gauden_dist_precompute(g,plVar1,varfloor);
        return g;
      }
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
              ,0x151,"Mixture-gaussians dimensions for means and variances differ\n");
LAB_0014bc67:
      ckd_free(local_40);
      gauden_free(g);
    }
  }
  return (gauden_t *)0x0;
}

Assistant:

gauden_t *
gauden_init(char const *meanfile, char const *varfile, float32 varfloor, logmath_t *lmath)
{
    int32 i, m, f, d, *flen;
    gauden_t *g;

    assert(meanfile != NULL);
    assert(varfile != NULL);
    assert(varfloor > 0.0);

    g = (gauden_t *) ckd_calloc(1, sizeof(gauden_t));
    g->lmath = logmath_retain(lmath);

    g->mean = (mfcc_t ****)gauden_param_read(meanfile, &g->n_mgau, &g->n_feat, &g->n_density,
                      &g->featlen);
    if (g->mean == NULL) {
	return NULL;
    }
    g->var = (mfcc_t ****)gauden_param_read(varfile, &m, &f, &d, &flen);
    if (g->var == NULL) {
	return NULL;
    }

    /* Verify mean and variance parameter dimensions */
    if ((m != g->n_mgau) || (f != g->n_feat) || (d != g->n_density)) {
        E_ERROR
            ("Mixture-gaussians dimensions for means and variances differ\n");
        ckd_free(flen);
        gauden_free(g);
        return NULL;
    }
    for (i = 0; i < g->n_feat; i++) {
        if (g->featlen[i] != flen[i]) {
            E_ERROR("Feature lengths for means and variances differ\n");
            ckd_free(flen);
            gauden_free(g);
            return NULL;
        }
    }

    ckd_free(flen);

    gauden_dist_precompute(g, lmath, varfloor);

    return g;
}